

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_client_handle_message
              (ptls_t *tls,ptls_buffer_t *sendbuf,size_t *epoch_offsets,size_t in_epoch,void *input,
              size_t inlen,ptls_handshake_properties_t *properties)

{
  int iVar1;
  size_t sVar2;
  st_ptls_record_t rec;
  st_ptls_raw_message_emitter_t emitter;
  
  if ((tls->field_0x160 & 1) == 0) {
    emitter.super.enc = &(tls->traffic_protection).enc;
    emitter.super.record_header_length = 0;
    emitter.super.begin_message = begin_raw_message;
    emitter.super.commit_message = commit_raw_message;
    emitter.start_off = 0xffffffffffffffff;
    rec.type = '\x16';
    rec.version = 0;
    rec.length = inlen;
    rec.fragment = (uint8_t *)input;
    emitter.super.buf = sendbuf;
    emitter.epoch_offsets = epoch_offsets;
    if (input == (void *)0x0) {
      iVar1 = send_client_hello(tls,&emitter.super,properties,(ptls_iovec_t *)0x0);
    }
    else {
      sVar2 = ptls_get_read_epoch(tls);
      if (sVar2 == in_epoch) {
        iVar1 = handle_handshake_record
                          (tls,handle_client_handshake_message,&emitter.super,&rec,properties);
      }
      else {
        iVar1 = 10;
      }
    }
    return iVar1;
  }
  __assert_fail("!tls->is_server",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                ,0x149d,
                "int ptls_client_handle_message(ptls_t *, ptls_buffer_t *, size_t *, size_t, const void *, size_t, ptls_handshake_properties_t *)"
               );
}

Assistant:

int ptls_client_handle_message(ptls_t *tls, ptls_buffer_t *sendbuf, size_t epoch_offsets[5], size_t in_epoch, const void *input,
                               size_t inlen, ptls_handshake_properties_t *properties)
{
    assert(!tls->is_server);

    struct st_ptls_raw_message_emitter_t emitter = {
        {sendbuf, &tls->traffic_protection.enc, 0, begin_raw_message, commit_raw_message}, SIZE_MAX, epoch_offsets};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0, inlen, input};

    if (input == NULL)
        return send_client_hello(tls, &emitter.super, properties, NULL);

    if (ptls_get_read_epoch(tls) != in_epoch)
        return PTLS_ALERT_UNEXPECTED_MESSAGE;

    return handle_handshake_record(tls, handle_client_handshake_message, &emitter.super, &rec, properties);
}